

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
SerializeMessageSet<proto2_unittest::TestAllTypes>::TestBody
          (SerializeMessageSet<proto2_unittest::TestAllTypes> *this)

{
  RepeatedPtrFieldBase *this_00;
  bool bVar1;
  MessageLite *pMVar2;
  string *psVar3;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>_>
  *pVVar4;
  undefined8 *puVar5;
  Nonnull<const_char_*> pcVar6;
  Arena *arena;
  pointer *__ptr_1;
  long lVar7;
  UnknownFieldSet *this_01;
  SooRep *this_02;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr;
  Metadata MVar9;
  string_view value;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  AssertionResult gtest_ar__2;
  TestMessageSetExtension2 message2;
  AssertionResult gtest_ar__3;
  TestMessageSetExtension1 message1;
  RawMessageSet raw;
  string data;
  TestMessageSet message_set;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  AssertHelper local_108;
  undefined1 local_100 [8];
  InternalMetadata local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  AssertHelper local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined1 local_d0 [8];
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_c8;
  anon_union_32_1_493b367e_for_TestMessageSetExtension1_5 local_c0;
  AssertHelper local_a0;
  undefined1 local_98 [16];
  anon_union_32_1_493b367e_for_RawMessageSet_3 local_88;
  string local_68;
  undefined1 local_48 [48];
  
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet
            ((TestMessageSet *)local_48,(Arena *)0x0);
  pMVar2 = ExtensionSet::MutableMessage
                     ((ExtensionSet *)(local_48 + 0x10),
                      proto2_unittest::TestMessageSetExtension1::message_set_extension,'\v',
                      (MessageLite *)proto2_unittest::_TestMessageSetExtension1_default_instance_,
                      (FieldDescriptor *)0x0);
  *(undefined4 *)&pMVar2[2]._internal_metadata_.ptr_ = 0x7b;
  *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 4;
  pMVar2 = ExtensionSet::MutableMessage
                     ((ExtensionSet *)(local_48 + 0x10),
                      proto2_unittest::TestMessageSetExtension2::message_set_extension,'\v',
                      (MessageLite *)proto2_unittest::_TestMessageSetExtension2_default_instance_,
                      (FieldDescriptor *)0x0);
  *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 1;
  arena = (Arena *)(pMVar2->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  ArenaStringPtr::Set((ArenaStringPtr *)&pMVar2[1]._internal_metadata_,value,arena);
  if ((local_48._8_8_ & 1) == 0) {
    this_01 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                        ((InternalMetadata *)(local_48 + 8));
  }
  else {
    this_01 = (UnknownFieldSet *)((local_48._8_8_ & 0xfffffffffffffffe) + 8);
  }
  psVar3 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_01,0x17a6e7);
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)psVar3->_M_string_length,0x1260a11);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar1 = MessageLite::SerializeToString((MessageLite *)local_48,&local_68);
  local_d0[0] = (internal)bVar1;
  local_c8._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )(_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_d0,
               (AssertionResult *)"message_set.SerializeToString(&data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x203,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,
                      (long)local_88._impl_.item_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ + 1
                     );
    }
    if ((long *)CONCAT44(local_100._4_4_,local_100._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_100._4_4_,local_100._0_4_) + 8))();
    }
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_c8._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_c8._M_t.
                   super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                   .
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl);
    }
    if (!bVar1) goto LAB_009dd07a;
  }
  proto2_unittest::RawMessageSet::RawMessageSet((RawMessageSet *)local_98,(Arena *)0x0);
  data_00._M_str = local_68._M_dataplus._M_p;
  data_00._M_len = local_68._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)local_98,data_00);
  local_100[0] = (internal)bVar1;
  local_f8.ptr_ = 0;
  if (bVar1) {
LAB_009dc869:
    local_100._0_4_ = 0;
    if ((local_98._8_8_ & 1) == 0) {
      this_02 = (SooRep *)&UnknownFieldSet::default_instance()::instance;
    }
    else {
      this_02 = (SooRep *)((local_98._8_8_ & 0xfffffffffffffffe) + 8);
    }
    local_128._0_4_ =
         SooRep::size(this_02,(undefined1  [16])
                              ((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                              (undefined1  [16])0x0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d0,"0","raw.unknown_fields().field_count()",(int *)local_100,
               (int *)local_128);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_100);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_c8._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar8 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar8 = *(char **)local_c8._M_t.
                           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           .
                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x209,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
      if ((long *)CONCAT44(local_100._4_4_,local_100._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100._4_4_,local_100._0_4_) + 8))();
      }
    }
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_c8._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_c8._M_t.
                   super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                   .
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl);
    }
    local_100._0_4_ = 3;
    local_128._0_4_ = local_88._impl_.item_.super_RepeatedPtrFieldBase.current_size_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d0,"3","raw.item_size()",(int *)local_100,(int *)local_128);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_100);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_c8._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar8 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar8 = *(char **)local_c8._M_t.
                           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           .
                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x20b,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
      if ((long *)CONCAT44(local_100._4_4_,local_100._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100._4_4_,local_100._0_4_) + 8))();
      }
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_c8._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c8._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl);
      }
    }
    else {
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_c8._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c8._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl);
      }
      MVar9 = proto2_unittest::TestMessageSetExtension1::GetMetadata
                        ((TestMessageSetExtension1 *)
                         proto2_unittest::_TestMessageSetExtension1_default_instance_);
      lVar7 = (long)(MVar9.descriptor)->extension_count_;
      if (lVar7 < 1) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,lVar7,"index < extension_count()");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa95,pcVar6);
LAB_009dd139:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_d0);
      }
      local_128._0_4_ = (MVar9.descriptor)->extensions_->number_;
      this_00 = (RepeatedPtrFieldBase *)(local_98 + 0x10);
      pVVar4 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                         (this_00,0);
      local_d0._0_4_ = (pVVar4->field_0)._impl_.type_id_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_100,
                 "TestFixture::TestMessageSetExtension1::descriptor() ->extension(0) ->number()",
                 "raw.item(0).type_id()",(int *)local_128,(int *)local_d0);
      if (local_100[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_d0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar8 = *(char **)local_f8.ptr_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x20f,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
        if ((long *)CONCAT44(local_d0._4_4_,local_d0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_d0._4_4_,local_d0._0_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_f8.ptr_);
      }
      MVar9 = proto2_unittest::TestMessageSetExtension2::GetMetadata
                        ((TestMessageSetExtension2 *)
                         proto2_unittest::_TestMessageSetExtension2_default_instance_);
      lVar7 = (long)(MVar9.descriptor)->extension_count_;
      if (lVar7 < 1) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,lVar7,"index < extension_count()");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa95,pcVar6);
        goto LAB_009dd139;
      }
      local_128._0_4_ = (MVar9.descriptor)->extensions_->number_;
      pVVar4 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                         (this_00,1);
      local_d0._0_4_ = (pVVar4->field_0)._impl_.type_id_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_100,
                 "TestFixture::TestMessageSetExtension2::descriptor() ->extension(0) ->number()",
                 "raw.item(1).type_id()",(int *)local_128,(int *)local_d0);
      if (local_100[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_d0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar8 = *(char **)local_f8.ptr_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x213,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
        if ((long *)CONCAT44(local_d0._4_4_,local_d0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_d0._4_4_,local_d0._0_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_f8.ptr_);
      }
      pVVar4 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                         (this_00,2);
      local_100._0_4_ = (pVVar4->field_0)._impl_.type_id_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_d0,"kUnknownTypeId","raw.item(2).type_id()",&kUnknownTypeId,
                 (int *)local_100);
      if (local_d0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_100);
        if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )local_c8._M_t.
              super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              .
              super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )0x0) {
          pcVar8 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar8 = *(char **)local_c8._M_t.
                             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                             .
                             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x214,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
        if ((long *)CONCAT44(local_100._4_4_,local_100._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_100._4_4_,local_100._0_4_) + 8))();
        }
      }
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_c8._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c8._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl);
      }
      proto2_unittest::TestMessageSetExtension1::TestMessageSetExtension1
                ((TestMessageSetExtension1 *)local_d0,(Arena *)0x0);
      pVVar4 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                         (this_00,0);
      puVar5 = (undefined8 *)
               ((ulong)(pVVar4->field_0)._impl_.message_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      data_01._M_str = (char *)*puVar5;
      data_01._M_len = puVar5[1];
      bVar1 = MessageLite::ParseFromString((MessageLite *)local_d0,data_01);
      local_128[0] = (internal)bVar1;
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_100,(internal *)local_128,
                   (AssertionResult *)"message1.ParseFromString(raw.item(0).message())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x217,(char *)CONCAT44(local_100._4_4_,local_100._0_4_));
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_100._4_4_,local_100._0_4_),
                          local_f0._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) + 8))();
        }
      }
      if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_120,local_120);
      }
      local_128._0_4_ = 0x7b;
      local_e0.data_._0_4_ = local_c0._impl_.i_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_100,"123","message1.i()",(int *)local_128,(int *)&local_e0);
      if (local_100[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_128);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar8 = *(char **)local_f8.ptr_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x218,pcVar8);
        testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        if ((long *)CONCAT44(local_128._4_4_,local_128._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_128._4_4_,local_128._0_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_f8.ptr_);
      }
      proto2_unittest::TestMessageSetExtension2::TestMessageSetExtension2
                ((TestMessageSetExtension2 *)local_100,(Arena *)0x0);
      pVVar4 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                         (this_00,1);
      puVar5 = (undefined8 *)
               ((ulong)(pVVar4->field_0)._impl_.message_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      data_02._M_str = (char *)*puVar5;
      data_02._M_len = puVar5[1];
      bVar1 = MessageLite::ParseFromString((MessageLite *)local_100,data_02);
      local_e0.data_._0_4_ = CONCAT31(local_e0.data_._1_3_,bVar1);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_128,(internal *)&local_e0,
                   (AssertionResult *)"message2.ParseFromString(raw.item(1).message())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x21b,(char *)CONCAT44(local_128._4_4_,local_128._0_4_));
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_128._4_4_,local_128._0_4_) != &local_118) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_128._4_4_,local_128._0_4_),
                          local_118._M_allocated_capacity + 1);
        }
        if (local_108.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_108.data_ + 8))();
        }
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
      testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                ((internal *)local_128,"\"foo\"","message2.str()",(char (*) [4])0x11364a4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0._8_8_ & 0xfffffffffffffffc));
      if (local_128[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_e0);
        if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar8 = (local_120->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x21c,pcVar8);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if ((long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) + 8))();
        }
      }
      if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_120,local_120);
      }
      pVVar4 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                         (this_00,2);
      testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                ((internal *)local_128,"\"bar\"","raw.item(2).message()",(char (*) [4])0x1260a11,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(pVVar4->field_0)._impl_.message_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      if (local_128[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_e0);
        if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar8 = (local_120->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x21e,pcVar8);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if ((long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) + 8))();
        }
      }
      if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_120,local_120);
      }
      proto2_unittest::TestMessageSetExtension2::~TestMessageSetExtension2
                ((TestMessageSetExtension2 *)local_100);
      proto2_unittest::TestMessageSetExtension1::~TestMessageSetExtension1
                ((TestMessageSetExtension1 *)local_d0);
    }
  }
  else {
    testing::Message::Message((Message *)local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_100,
               (AssertionResult *)"raw.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x207,(char *)CONCAT44(local_d0._4_4_,local_d0._0_4_));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_32_1_493b367e_for_TestMessageSetExtension1_5 *)
        CONCAT44(local_d0._4_4_,local_d0._0_4_) != &local_c0) {
      operator_delete((anon_union_32_1_493b367e_for_TestMessageSetExtension1_5 *)
                      CONCAT44(local_d0._4_4_,local_d0._0_4_),local_c0._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_128._4_4_,local_128._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_128._4_4_,local_128._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_f8.ptr_);
    }
    if (bVar1) goto LAB_009dc869;
  }
  proto2_unittest::RawMessageSet::~RawMessageSet((RawMessageSet *)local_98);
LAB_009dd07a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_48);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, SerializeMessageSet) {
  // Set up a TestMessageSet with two known messages and an unknown one.
  typename TestFixture::TestMessageSet message_set;
  message_set
      .MutableExtension(
          TestFixture::TestMessageSetExtension1::message_set_extension)
      ->set_i(123);
  message_set
      .MutableExtension(
          TestFixture::TestMessageSetExtension2::message_set_extension)
      ->set_str("foo");
  message_set.mutable_unknown_fields()->AddLengthDelimited(kUnknownTypeId,
                                                           "bar");

  std::string data;
  ASSERT_TRUE(message_set.SerializeToString(&data));

  // Parse back using RawMessageSet and check the contents.
  typename TestFixture::RawMessageSet raw;
  ASSERT_TRUE(raw.ParseFromString(data));

  EXPECT_EQ(0, raw.unknown_fields().field_count());

  ASSERT_EQ(3, raw.item_size());
  EXPECT_EQ(TestFixture::TestMessageSetExtension1::descriptor()
                ->extension(0)
                ->number(),
            raw.item(0).type_id());
  EXPECT_EQ(TestFixture::TestMessageSetExtension2::descriptor()
                ->extension(0)
                ->number(),
            raw.item(1).type_id());
  EXPECT_EQ(kUnknownTypeId, raw.item(2).type_id());

  typename TestFixture::TestMessageSetExtension1 message1;
  EXPECT_TRUE(message1.ParseFromString(raw.item(0).message()));
  EXPECT_EQ(123, message1.i());

  typename TestFixture::TestMessageSetExtension2 message2;
  EXPECT_TRUE(message2.ParseFromString(raw.item(1).message()));
  EXPECT_EQ("foo", message2.str());

  EXPECT_EQ("bar", raw.item(2).message());
}